

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

HeaderSize HPack::header_size(HttpHeader *header)

{
  bool bVar1;
  uint uVar2;
  HeaderSize HVar3;
  long in_FS_OFFSET;
  HeaderField *field;
  HttpHeader *__range1;
  HeaderSize delta;
  const_iterator __end1;
  const_iterator __begin1;
  HeaderSize size;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  uint uStack_34;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_28;
  int local_20;
  bool local_19;
  pair<bool,_unsigned_int> local_18;
  HeaderSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.first = true;
  local_18._1_3_ = 0xaaaaaa;
  local_18.second = 0xaaaaaaaa;
  local_19 = true;
  local_20 = 0;
  std::pair<bool,_unsigned_int>::pair<bool,_int,_true>(&local_18,&local_19,&local_20);
  local_28._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_28._M_current =
       (HeaderField *)
       std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                 ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                  in_stack_ffffffffffffffb0);
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
            ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
             in_stack_ffffffffffffffb0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                        *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      local_10.first = local_18.first;
      local_10._1_3_ = local_18._1_3_;
      local_10.second = local_18.second;
LAB_0029041b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_10;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
         ::operator*(&local_28);
    HVar3 = entry_size(in_stack_ffffffffffffffb0);
    if (((ulong)HVar3 & 1) == 0) {
      std::pair<bool,_unsigned_int>::pair<bool,_unsigned_int,_true>(&local_10);
      goto LAB_0029041b;
    }
    uVar2 = std::numeric_limits<unsigned_int>::max();
    uStack_34 = HVar3.second;
    if (uVar2 - local_18.second < uStack_34) {
      std::pair<bool,_unsigned_int>::pair<bool,_unsigned_int,_true>(&local_10);
      goto LAB_0029041b;
    }
    local_18.second = uStack_34 + local_18.second;
    __gnu_cxx::
    __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

HeaderSize header_size(const HttpHeader &header)
{
    HeaderSize size(true, 0);
    for (const HeaderField &field : header) {
        HeaderSize delta = entry_size(field);
        if (!delta.first)
            return HeaderSize();
        if (std::numeric_limits<quint32>::max() - size.second < delta.second)
            return HeaderSize();
        size.second += delta.second;
    }

    return size;
}